

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O3

DdNode ** Cudd_bddCharToVect(DdManager *dd,DdNode *f)

{
  DdNode **__ptr;
  int *piVar1;
  DdNode *pDVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if ((DdNode *)((ulong)dd->one ^ 1) == f) {
    return (DdNode **)0x0;
  }
  iVar3 = dd->size;
  __ptr = (DdNode **)malloc((long)iVar3 * 8);
  if (__ptr == (DdNode **)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    return (DdNode **)0x0;
  }
  dd->reordered = 0;
  if (0 < iVar3) {
LAB_007d8149:
    piVar1 = dd->invperm;
    lVar5 = 0;
LAB_007d8153:
    pDVar2 = cuddBddCharToVect(dd,f,dd->vars[piVar1[lVar5]]);
    if (pDVar2 != (DdNode *)0x0) goto code_r0x007d8175;
    if (lVar5 != 0) {
      lVar4 = 0;
      do {
        Cudd_IterDerefBdd(dd,__ptr[dd->invperm[lVar4]]);
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
    }
    if (dd->reordered != 1) goto LAB_007d81f8;
    iVar3 = dd->size;
    goto LAB_007d81e0;
  }
LAB_007d81f8:
  free(__ptr);
  return (DdNode **)0x0;
code_r0x007d8175:
  piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  piVar1 = dd->invperm;
  __ptr[piVar1[lVar5]] = pDVar2;
  lVar5 = lVar5 + 1;
  iVar3 = dd->size;
  if (iVar3 <= lVar5) goto code_r0x007d819d;
  goto LAB_007d8153;
code_r0x007d819d:
  if (dd->reordered != 1) {
    return __ptr;
  }
LAB_007d81e0:
  dd->reordered = 0;
  if (iVar3 < 1) goto code_r0x007d81f3;
  goto LAB_007d8149;
code_r0x007d81f3:
  if (pDVar2 != (DdNode *)0x0) {
    return __ptr;
  }
  goto LAB_007d81f8;
}

Assistant:

DdNode **
Cudd_bddCharToVect(
  DdManager * dd,
  DdNode * f)
{
    int i, j;
    DdNode **vect;
    DdNode *res = NULL;

    if (f == Cudd_Not(DD_ONE(dd))) return(NULL);

    vect = ABC_ALLOC(DdNode *, dd->size);
    if (vect == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    do {
        dd->reordered = 0;
        for (i = 0; i < dd->size; i++) {
            res = cuddBddCharToVect(dd,f,dd->vars[dd->invperm[i]]);
            if (res == NULL) {
                /* Clean up the vector array in case reordering took place. */
                for (j = 0; j < i; j++) {
                    Cudd_IterDerefBdd(dd, vect[dd->invperm[j]]);
                }
                break;
            }
            cuddRef(res);
            vect[dd->invperm[i]] = res;
        }
    } while (dd->reordered == 1);
    if (res == NULL) {
        ABC_FREE(vect);
        return(NULL);
    }
    return(vect);

}